

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtemporaryfile.cpp
# Opt level: O0

NativePath * __thiscall QTemporaryFileName::generateNext(QTemporaryFileName *this)

{
  char *pcVar1;
  long in_RSI;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  Char *placeholderEnd;
  Char *placeholderStart;
  anon_class_16_2_d9465bab applyOne;
  quint32 rnd;
  Char *rIter;
  QByteArray *in_stack_ffffffffffffff98;
  QByteArray *this_00;
  anon_class_16_2_d9465bab local_28;
  quint32 local_14;
  char *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  pcVar1 = QByteArray::data(in_RDI);
  pcVar1 = pcVar1 + *(long *)(in_RSI + 0x18);
  local_10 = pcVar1 + *(long *)(in_RSI + 0x20);
  while (local_10 != pcVar1) {
    QRandomGenerator::global();
    local_14 = QRandomGenerator::generate((QRandomGenerator *)0x2f7c0b);
    local_28.rnd = &local_14;
    local_28.rIter = &local_10;
    generateNext::anon_class_16_2_d9465bab::operator()(&local_28);
    if ((local_10 == pcVar1) ||
       (generateNext::anon_class_16_2_d9465bab::operator()(&local_28), local_10 == pcVar1)) break;
    generateNext::anon_class_16_2_d9465bab::operator()(&local_28);
  }
  QByteArray::QByteArray(this_00,in_stack_ffffffffffffff98);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QFileSystemEntry::NativePath QTemporaryFileName::generateNext()
{
    Q_ASSERT(length != 0);
    Q_ASSERT(pos < path.size());
    Q_ASSERT(length <= path.size() - pos);

    Char *const placeholderStart = (Char *)path.data() + pos;
    Char *const placeholderEnd = placeholderStart + length;

    // Replace placeholder with random chars.
    {
        // Since our dictionary is 26+26 characters, it would seem we only need
        // a random number from 0 to 63 to select a character. However, due to
        // the limited range, that would mean 12 (64-52) characters have double
        // the probability of the others: 1 in 32 instead of 1 in 64.
        //
        // To overcome this limitation, we use more bits per character. With 10
        // bits, there are 16 characters with probability 19/1024 and the rest
        // at 20/1024 (i.e, less than .1% difference). This allows us to do 3
        // characters per 32-bit random number, which is also half the typical
        // placeholder length.
        enum { BitsPerCharacter = 10 };

        Char *rIter = placeholderEnd;
        while (rIter != placeholderStart) {
            quint32 rnd = QRandomGenerator::global()->generate();
            auto applyOne = [&]() {
                quint32 v = rnd & ((1 << BitsPerCharacter) - 1);
                rnd >>= BitsPerCharacter;
                char ch = char((26 + 26) * v / (1 << BitsPerCharacter));
                if (ch < 26)
                    *--rIter = Latin1Char(ch + 'A');
                else
                    *--rIter = Latin1Char(ch - 26 + 'a');
            };

            applyOne();
            if (rIter == placeholderStart)
                break;

            applyOne();
            if (rIter == placeholderStart)
                break;

            applyOne();
        }
    }

    return path;
}